

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  BufferPackingStandard packing_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  mapped_type *pmVar6;
  SPIRType *pSVar7;
  CompilerError *pCVar8;
  BufferPackingStandard extraout_EDX;
  uint uVar9;
  ulong uVar10;
  CompilerGLSL *pCVar11;
  uint uVar12;
  ulong uVar13;
  allocator local_ad;
  BufferPackingStandard local_ac;
  CompilerGLSL *local_a8;
  SPIRType *local_a0;
  ID *local_98;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  Bitset member_flags;
  
  bVar1 = Compiler::type_is_top_level_physical_pointer(&this->super_Compiler,type);
  if (bVar1) {
    if (type->pointer == false) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&member_flags,"Types in PhysicalStorageBufferEXT must be pointers.",
                 &local_ad);
      CompilerError::CompilerError(pCVar8,(string *)&member_flags);
      __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
      pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&member_flags,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                 ,&local_ad);
      CompilerError::CompilerError(pCVar8,(string *)&member_flags);
      __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78 = 8;
    goto LAB_00252e17;
  }
  pCVar11 = this;
  bVar1 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
  if (bVar1) {
    uVar2 = to_array_size_literal(this,type);
    uVar3 = type_to_packed_array_stride(this,type,flags,packing);
    uVar12 = uVar3 * uVar2;
    local_78 = (ulong)uVar12;
    if (((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) ||
       (*(int *)&(type->super_IVariant).field_0xc == 0xf)) goto LAB_00252e17;
    uVar4 = type->width;
    uVar9 = type->vecsize;
LAB_00252cc9:
    uVar12 = (uVar4 >> 3) * (uVar9 - 4) + uVar12;
  }
  else {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      local_90 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
      local_98 = &(type->super_IVariant).self;
      local_78 = 0;
      uVar13 = 1;
      uVar9 = 0;
      local_ac = packing;
      local_a8 = this;
      local_a0 = type;
      while (pSVar7 = local_a0, pCVar11 = local_a8, uVar10 = (ulong)uVar9,
            uVar10 < (local_a0->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size) {
        local_88 = uVar13;
        pmVar6 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_90,local_98);
        Bitset::Bitset(&member_flags,
                       &(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr
                        [uVar10].decoration_flags);
        local_80 = uVar10;
        pSVar7 = Compiler::get<spirv_cross::SPIRType>
                           (&pCVar11->super_Compiler,
                            (pSVar7->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar10].id);
        packing_00 = local_ac;
        uVar2 = type_to_packed_alignment(pCVar11,pSVar7,&member_flags,local_ac);
        iVar5 = *(int *)&(pSVar7->super_IVariant).field_0xc;
        uVar3 = type_to_packed_size(pCVar11,pSVar7,&member_flags,packing_00);
        uVar13 = 1;
        if (iVar5 == 0xf) {
          uVar13 = (ulong)uVar2;
        }
        uVar9 = (uint)local_88;
        if ((uint)local_88 < uVar2) {
          uVar9 = uVar2;
        }
        iVar5 = (int)local_78;
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&member_flags.higher._M_h);
        local_78 = (ulong)(uVar3 + (-uVar9 & (iVar5 + uVar9) - 1));
        uVar9 = (int)local_80 + 1;
      }
      goto LAB_00252e17;
    }
    uVar2 = type_to_packed_base_size(pCVar11,type,extraout_EDX);
    if ((packing & ~BufferPackingStd430) != BufferPackingScalar) {
      uVar9 = type->vecsize;
      uVar4 = type->columns;
      uVar12 = uVar9 * uVar2;
      local_78 = 0;
      if (uVar4 == 1) {
        local_78 = (ulong)uVar12;
      }
      uVar13 = flags->lower;
      if ((1 < uVar4 & (byte)((uVar13 & 0xffffffff) >> 5) & 7) == 1) {
        if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
          local_78 = (ulong)(uVar2 * uVar4 * 4);
          goto LAB_00252e76;
        }
        if (uVar9 != 3) {
          local_78 = (ulong)(uVar12 * uVar4);
          goto LAB_00252e76;
        }
        if ((uVar13 & 0x10) != 0) goto LAB_00252e85;
        local_78 = (ulong)(uVar2 * uVar4 * 4);
      }
      else {
LAB_00252e76:
        if (((byte)uVar13 >> 4 & 1 < uVar9) != 0) {
LAB_00252e85:
          if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
             (uVar4 == 3)) {
            uVar12 = uVar12 * 4;
          }
          else {
            uVar12 = uVar12 * uVar4;
          }
          local_78 = (ulong)uVar12;
        }
      }
      uVar12 = (uint)local_78;
      if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar4 < 2)
      goto LAB_00252e17;
      uVar4 = type->width;
      goto LAB_00252cc9;
    }
    uVar12 = uVar2 * type->vecsize * type->columns;
  }
  local_78 = (ulong)uVar12;
LAB_00252e17:
  return (uint32_t)local_78;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type_is_top_level_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (type_is_top_level_array(type))
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}